

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O2

unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> __thiscall
duckdb::AlterInfo::Deserialize(AlterInfo *this,Deserializer *deserializer)

{
  AlterType AVar1;
  OnEntryNotFound OVar2;
  bool bVar3;
  pointer pAVar4;
  SerializationException *this_00;
  __uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_> local_b8;
  allocator local_a9;
  _Head_base<0UL,_duckdb::AlterInfo_*,_false> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> schema;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> catalog;
  
  AVar1 = Deserializer::ReadProperty<duckdb::AlterType>(deserializer,200,"type");
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>(&catalog,deserializer,0xc9,"catalog");
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>(&schema,deserializer,0xca,"schema");
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>(&name,deserializer,0xcb,"name");
  OVar2 = Deserializer::ReadProperty<duckdb::OnEntryNotFound>(deserializer,0xcc,"if_not_found");
  bVar3 = Deserializer::ReadPropertyWithDefault<bool>(deserializer,0xcd,"allow_internal");
  switch(AVar1) {
  case ALTER_TABLE:
    AlterTableInfo::Deserialize((AlterTableInfo *)&stack0xffffffffffffff58,deserializer);
    break;
  case ALTER_VIEW:
    AlterViewInfo::Deserialize((AlterViewInfo *)&stack0xffffffffffffff58,deserializer);
    break;
  default:
    this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff58,
               "Unsupported type for deserialization of AlterInfo!",&local_a9);
    SerializationException::SerializationException(this_00,(string *)&stack0xffffffffffffff58);
    __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
  case CHANGE_OWNERSHIP:
    ChangeOwnershipInfo::Deserialize((ChangeOwnershipInfo *)&stack0xffffffffffffff58,deserializer);
    break;
  case SET_COMMENT:
    SetCommentInfo::Deserialize((SetCommentInfo *)&stack0xffffffffffffff58,deserializer);
    break;
  case SET_COLUMN_COMMENT:
    SetColumnCommentInfo::Deserialize((SetColumnCommentInfo *)&stack0xffffffffffffff58,deserializer)
    ;
  }
  local_b8._M_t.super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>
  .super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl =
       (tuple<duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>)
       (tuple<duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>)local_a8._M_head_impl;
  pAVar4 = unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
                     ((unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> *
                      )&local_b8);
  ::std::__cxx11::string::operator=((string *)&pAVar4->catalog,(string *)&catalog);
  pAVar4 = unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
                     ((unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> *
                      )&local_b8);
  ::std::__cxx11::string::operator=((string *)&pAVar4->schema,(string *)&schema);
  pAVar4 = unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
                     ((unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> *
                      )&local_b8);
  ::std::__cxx11::string::operator=((string *)&pAVar4->name,(string *)&name);
  pAVar4 = unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
                     ((unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> *
                      )&local_b8);
  (pAVar4->super_ParseInfo).field_0xa = OVar2;
  pAVar4 = unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
                     ((unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> *
                      )&local_b8);
  pAVar4->allow_internal = bVar3;
  (this->super_ParseInfo)._vptr_ParseInfo =
       (_func_int **)
       local_b8._M_t.
       super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
       super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl;
  ::std::__cxx11::string::~string((string *)&name);
  ::std::__cxx11::string::~string((string *)&schema);
  ::std::__cxx11::string::~string((string *)&catalog);
  return (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)
         (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)this;
}

Assistant:

unique_ptr<ParseInfo> AlterInfo::Deserialize(Deserializer &deserializer) {
	auto type = deserializer.ReadProperty<AlterType>(200, "type");
	auto catalog = deserializer.ReadPropertyWithDefault<string>(201, "catalog");
	auto schema = deserializer.ReadPropertyWithDefault<string>(202, "schema");
	auto name = deserializer.ReadPropertyWithDefault<string>(203, "name");
	auto if_not_found = deserializer.ReadProperty<OnEntryNotFound>(204, "if_not_found");
	auto allow_internal = deserializer.ReadPropertyWithDefault<bool>(205, "allow_internal");
	unique_ptr<AlterInfo> result;
	switch (type) {
	case AlterType::ALTER_TABLE:
		result = AlterTableInfo::Deserialize(deserializer);
		break;
	case AlterType::ALTER_VIEW:
		result = AlterViewInfo::Deserialize(deserializer);
		break;
	case AlterType::CHANGE_OWNERSHIP:
		result = ChangeOwnershipInfo::Deserialize(deserializer);
		break;
	case AlterType::SET_COLUMN_COMMENT:
		result = SetColumnCommentInfo::Deserialize(deserializer);
		break;
	case AlterType::SET_COMMENT:
		result = SetCommentInfo::Deserialize(deserializer);
		break;
	default:
		throw SerializationException("Unsupported type for deserialization of AlterInfo!");
	}
	result->catalog = std::move(catalog);
	result->schema = std::move(schema);
	result->name = std::move(name);
	result->if_not_found = if_not_found;
	result->allow_internal = allow_internal;
	return std::move(result);
}